

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

UObject * __thiscall
icu_63::DefaultCalendarFactory::create
          (DefaultCalendarFactory *this,ICUServiceKey *key,ICUService *param_2,UErrorCode *status)

{
  ECalType EVar1;
  UnicodeString *pUVar2;
  char *locid;
  Locale *this_00;
  UnicodeString *local_1d0;
  UnicodeString local_1c0;
  ConstChar16Ptr local_180;
  UnicodeString local_178;
  undefined1 local_131;
  UnicodeString *local_130;
  UnicodeString *local_128;
  UnicodeString *ret;
  undefined1 local_110 [8];
  Locale loc;
  LocaleKey *lkey;
  UErrorCode *status_local;
  ICUService *param_2_local;
  ICUServiceKey *key_local;
  DefaultCalendarFactory *this_local;
  
  this_00 = (Locale *)local_110;
  loc._216_8_ = key;
  Locale::Locale(this_00);
  (**(code **)(*(long *)loc._216_8_ + 0x60))();
  pUVar2 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)this_00);
  local_131 = 0;
  local_1d0 = (UnicodeString *)0x0;
  if (pUVar2 != (UnicodeString *)0x0) {
    local_131 = 1;
    local_130 = pUVar2;
    UnicodeString::UnicodeString(pUVar2);
    local_1d0 = pUVar2;
  }
  local_128 = local_1d0;
  if (local_1d0 == (UnicodeString *)0x0) {
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    UnicodeString::append(local_1d0,L'@');
    pUVar2 = local_128;
    ConstChar16Ptr::ConstChar16Ptr(&local_180,L"calendar=");
    UnicodeString::UnicodeString(&local_178,'\x01',&local_180,9);
    UnicodeString::append(pUVar2,&local_178);
    UnicodeString::~UnicodeString(&local_178);
    ConstChar16Ptr::~ConstChar16Ptr(&local_180);
    pUVar2 = local_128;
    locid = Locale::getName((Locale *)local_110);
    EVar1 = getCalendarTypeForLocale(locid);
    UnicodeString::UnicodeString(&local_1c0,gCalTypes[EVar1],-1,kInvariant);
    UnicodeString::append(pUVar2,&local_1c0);
    UnicodeString::~UnicodeString(&local_1c0);
  }
  pUVar2 = local_128;
  Locale::~Locale((Locale *)local_110);
  return (UObject *)pUVar2;
}

Assistant:

virtual UObject* create(const ICUServiceKey& key, const ICUService* /*service*/, UErrorCode& status) const  {

        LocaleKey &lkey = (LocaleKey&)key;
        Locale loc;
        lkey.currentLocale(loc);

        UnicodeString *ret = new UnicodeString();
        if (ret == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
        } else {
            ret->append((UChar)0x40); // '@' is a variant character
            ret->append(UNICODE_STRING("calendar=", 9));
            ret->append(UnicodeString(gCalTypes[getCalendarTypeForLocale(loc.getName())], -1, US_INV));
        }
        return ret;
    }